

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O2

void __thiscall ExternRefSymbol::saveXml(ExternRefSymbol *this,ostream *s)

{
  allocator local_39;
  string local_38;
  
  std::operator<<(s,"<externrefsymbol");
  std::__cxx11::string::string((string *)&local_38,"name",&local_39);
  a_v(s,&local_38,&(this->super_Symbol).name);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator<<(s,">\n");
  Address::saveXml(&this->refaddr,s);
  std::operator<<(s,"</externrefsymbol>\n");
  return;
}

Assistant:

void ExternRefSymbol::saveXml(ostream &s) const

{
  s << "<externrefsymbol";
  a_v(s,"name",name);
  s << ">\n";
  refaddr.saveXml(s);
  s << "</externrefsymbol>\n";
}